

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O3

int lj_cf_buffer_method_decode(lua_State *L)

{
  TValue *pTVar1;
  uint64_t uVar2;
  SBufExt *sbx;
  char *pcVar3;
  
  sbx = buffer_tobuf(L);
  (sbx->L).ptr64 = (ulong)((uint)(sbx->L).ptr64 & 7) | (ulong)L;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->u64 = 0xffffffffffffffff;
  pcVar3 = lj_serialize_get(sbx,L->top + -1);
  sbx->r = pcVar3;
  uVar2 = (L->glref).ptr64;
  if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(buffer_method_decode)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobufw(L);
  setnilV(L->top++);
  sbx->r = lj_serialize_get(sbx, L->top-1);
  lj_gc_check(L);
  return 1;
}